

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

condition_unique_ptr_t __thiscall
so_5::disp::mpmc_queue_traits::combined_lock::actual_lock_t::allocate_condition(actual_lock_t *this)

{
  actual_cond_t *this_00;
  long in_RSI;
  actual_lock_t *this_local;
  
  this_00 = (actual_cond_t *)operator_new(0x78);
  actual_cond_t::actual_cond_t(this_00,(spinlock_t *)(in_RSI + 8),(duration)*(rep *)(in_RSI + 0x10))
  ;
  std::
  unique_ptr<so_5::disp::mpmc_queue_traits::condition_t,std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>>
  ::unique_ptr<std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>,void>
            ((unique_ptr<so_5::disp::mpmc_queue_traits::condition_t,std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>>
              *)this,(pointer)this_00);
  return (__uniq_ptr_data<so_5::disp::mpmc_queue_traits::condition_t,_std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>,_true,_true>
          )(__uniq_ptr_data<so_5::disp::mpmc_queue_traits::condition_t,_std::default_delete<so_5::disp::mpmc_queue_traits::condition_t>,_true,_true>
            )this;
}

Assistant:

virtual condition_unique_ptr_t
		allocate_condition() override
			{
				return condition_unique_ptr_t{
					new actual_cond_t{ m_spinlock, m_waiting_time } };
			}